

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindBuffersBaseTest::iterate(FunctionalBindBuffersBaseTest *this)

{
  pointer *this_00;
  GLenum pname;
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar8;
  TestError *this_01;
  GLint j_1;
  GLuint GVar9;
  uint uVar10;
  long lVar11;
  GLint j;
  long lVar12;
  ulong uVar13;
  GLint max_buffers;
  GLenum local_250;
  GLint max_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_ids;
  vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> buffer;
  Enum<int,_2UL> local_1f8;
  Enum<int,_2UL> local_1e8;
  string local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_buffer_ids;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  lVar8 = 0;
  while( true ) {
    if (lVar8 == 4) {
      tcu::TestContext::setTestResult
                (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    local_250 = (&s_buffer_infos)[lVar8 * 5];
    pname = (&DAT_016668f8)[lVar8 * 5];
    uVar1 = (&DAT_016668fc)[lVar8 * 5];
    uVar2 = (&DAT_01666900)[lVar8 * 5];
    t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)glu::getBufferTargetName;
    t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(t_buffer_ids.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,local_250);
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1d8,&t_buffer_ids);
    max_buffers = 0;
    max_size = 0;
    (**(code **)(lVar7 + 0x868))(uVar1,&max_buffers);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x968);
    (**(code **)(lVar7 + 0x868))(uVar2,&max_size);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x96c);
    iVar5 = max_size / max_buffers;
    buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::resize
              (&buffer,(long)max_buffers);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&buffer_ids,(long)max_buffers);
    lVar11 = 0;
    for (lVar12 = 0; lVar12 < max_buffers; lVar12 = lVar12 + 1) {
      MultiBind::Buffer::InitData
                ((Buffer *)
                 ((long)&(buffer.
                          super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar11),
                 (this->super_TestCase).m_context,local_250,0x88ea,(long)iVar5,(GLvoid *)0x0);
      buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12] =
           *(uint *)((long)&(buffer.
                             super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar11);
      lVar11 = lVar11 + 0x18;
    }
    (**(code **)(lVar7 + 0x58))
              (local_250,0,(long)max_buffers,
               buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x984);
    for (lVar11 = 0; lVar11 < max_buffers; lVar11 = lVar11 + 1) {
      checkBinding((this->super_TestCase).m_context,pname,(GLuint)lVar11,&local_1d8,
                   buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11]);
    }
    uVar3 = (long)max_buffers / 2;
    iVar5 = (int)uVar3;
    (**(code **)(lVar7 + 0x58))(local_250,0,uVar3 & 0xffffffff,0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x996);
    uVar13 = 0;
    GVar9 = 0;
    if (0 < iVar5) {
      uVar13 = uVar3 & 0xffffffff;
      GVar9 = 0;
    }
    for (; (GLuint)uVar13 != GVar9; GVar9 = GVar9 + 1) {
      checkBinding((this->super_TestCase).m_context,pname,GVar9,&local_1d8,0);
    }
    for (lVar11 = (long)iVar5; lVar11 < max_buffers; lVar11 = lVar11 + 1) {
      checkBinding((this->super_TestCase).m_context,pname,(GLuint)lVar11,&local_1d8,
                   buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11]);
    }
    (**(code **)(lVar7 + 0x58))(local_250,uVar3 & 0xffffffff,max_buffers - iVar5,0);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9a3);
    for (GVar9 = 0; (int)GVar9 < max_buffers; GVar9 = GVar9 + 1) {
      checkBinding((this->super_TestCase).m_context,pname,GVar9,&local_1d8,0);
    }
    uVar10 = 1;
    while( true ) {
      cVar4 = (**(code **)(lVar7 + 0xc68))(uVar10);
      if (cVar4 != '\x01') break;
      uVar10 = uVar10 + 1;
    }
    *buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar10;
    (**(code **)(lVar7 + 0x58))(local_250,0,max_buffers);
    local_1e8.m_value = (**(code **)(lVar7 + 0x800))();
    if (local_1e8.m_value != 0x502) break;
    *buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = 0;
    for (lVar11 = 0; lVar11 < max_buffers; lVar11 = lVar11 + 1) {
      checkBinding((this->super_TestCase).m_context,pname,(GLuint)lVar11,&local_1d8,
                   buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11]);
    }
    (**(code **)(lVar7 + 0x48))
              (local_250,0,
               (buffer.
                super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                ._M_impl.super__Vector_impl_data._M_start)->m_id);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"BindBufferBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9d1);
    checkBinding((this->super_TestCase).m_context,pname,0,&local_1d8,
                 (buffer.
                  super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_id);
    t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&t_buffer_ids,(long)max_buffers);
    (**(code **)(lVar7 + 0x58))
              (local_250,0,1,
               t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"BindBuffersBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x9d8);
    for (lVar11 = 0; lVar11 < max_buffers; lVar11 = lVar11 + 1) {
      checkBinding((this->super_TestCase).m_context,pname,(GLuint)lVar11,&local_1d8,
                   buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11]);
    }
    (**(code **)(lVar7 + 0x58))(local_250,0,(long)max_buffers,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::~vector
              (&buffer);
    std::__cxx11::string::~string((string *)&local_1d8);
    lVar8 = lVar8 + 1;
  }
  t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = &t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"File: ");
  std::operator<<((ostream *)this_00,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 );
  std::operator<<((ostream *)this_00,", line: ");
  std::ostream::operator<<(this_00,0x9c0);
  std::operator<<((ostream *)this_00,". Got wrong error: ");
  local_1e8.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)this_00);
  std::operator<<((ostream *)this_00,", expected: ");
  local_1f8.m_getName = glu::getErrorName;
  local_1f8.m_value = 0x502;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1f8,(ostream *)this_00);
  std::operator<<((ostream *)this_00,", message: ");
  std::operator<<((ostream *)this_00,"BindBufferBase with invalid buffer id");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&t_buffer_ids,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x9c0);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindBuffersBaseTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	for (size_t i = 0; i < s_n_buffer_tragets; ++i)
	{
		const GLenum	   pname_binding  = s_buffer_infos[i].m_pname_binding;
		const GLenum	   pname_max	  = s_buffer_infos[i].m_pname_max;
		const GLenum	   pname_max_size = s_buffer_infos[i].m_pname_max_size;
		const GLenum	   target		  = s_buffer_infos[i].m_target;
		const std::string& target_name	= glu::getBufferTargetStr(target).toString();

		GLint max_buffers = 0;
		GLint max_size	= 0;

		/* Get max */
		gl.getIntegerv(pname_max, &max_buffers);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		/* Get max size */
		gl.getIntegerv(pname_max_size, &max_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		GLintptr buffer_size = max_size / max_buffers;

		/* Storage */
		std::vector<Buffer> buffer;
		std::vector<GLuint> buffer_ids;

		buffer.resize(max_buffers);
		buffer_ids.resize(max_buffers);

		/* Prepare buffers */
		for (GLint j = 0; j < max_buffers; ++j)
		{
			buffer[j].InitData(m_context, target, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

			buffer_ids[j] = buffer[j].m_id;
		}

		/*
		 * - execute BindBufferBase to bind all buffers to tested target;
		 * - inspect if bindings were modified;
		 */
		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, &buffer_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/*
		 *
		 * - execute BindBufferBase for first half of bindings with NULL as <buffers>
		 * to unbind first half of bindings for tested target;
		 * - inspect if bindings were modified;
		 * - execute BindBufferBase for second half of bindings with NULL as <buffers>
		 * to unbind rest of bindings;
		 * - inspect if bindings were modified;
		 */
		GLint half_index = max_buffers / 2;
		gl.bindBuffersBase(target, 0 /* first */, half_index /* count */, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < half_index; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, 0);
		}

		for (GLint j = half_index; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		gl.bindBuffersBase(target, half_index /* first */, max_buffers - half_index /* count */, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, 0);
		}

		/*
		 * - change <buffers> so first entry is invalid;
		 * - execute BindBufferBase to bind all buffers to tested target; It is
		 * expected that INVALID_OPERATION will be generated;
		 * - inspect if all bindings but first were modified;
		 */

		/* Find invalid id */
		GLuint invalid_id = 1;
		while (1)
		{
			if (GL_TRUE != gl.isBuffer(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		buffer_ids[0] = invalid_id;

		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, &buffer_ids[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindBufferBase with invalid buffer id");

		/* Update buffer_ids */
		buffer_ids[0] = 0; /* 0 means unbound */

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/*
		 * - bind any buffer to first binding;
		 * - execute BindBufferBase for 0 as <first>, 1 as <count> and <buffers> filled
		 * with zeros to unbind 1st binding for tested target;
		 * - inspect if bindings were modified;
		 */
		gl.bindBufferBase(target, 0, buffer[0].m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferBase");
		checkBinding(m_context, pname_binding, 0, target_name, buffer[0].m_id);

		std::vector<GLuint> t_buffer_ids;
		t_buffer_ids.resize(max_buffers);

		gl.bindBuffersBase(target, 0 /* first */, 1 /* count */, &t_buffer_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffersBase");

		for (GLint j = 0; j < max_buffers; ++j)
		{
			checkBinding(m_context, pname_binding, j, target_name, buffer_ids[j]);
		}

		/* - unbind all buffers. */
		gl.bindBuffersBase(target, 0 /* first */, max_buffers /* count */, 0);
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}